

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockPluginTest.cpp
# Opt level: O1

void __thiscall
TEST_MockPlugin_checkExpectationsWorksAlsoWithHierachicalObjects_Test::testBody
          (TEST_MockPlugin_checkExpectationsWorksAlsoWithHierachicalObjects_Test *this)

{
  int iVar1;
  MockCheckedExpectedCall *pMVar2;
  MockSupport *pMVar3;
  undefined4 extraout_var;
  UtestShell *pUVar4;
  char *pcVar5;
  char *pcVar6;
  MockFailureReporterInstaller failureReporterInstaller;
  MockExpectedCallsListForTest expectations;
  MockExpectedObjectDidntHappenFailure expectedFailure;
  MockFailureReporterInstaller local_b1;
  undefined1 local_b0 [152];
  
  MockFailureReporterInstaller::MockFailureReporterInstaller(&local_b1);
  MockExpectedCallsList::MockExpectedCallsList((MockExpectedCallsList *)(local_b0 + 0x20));
  local_b0._32_8_ = &PTR__MockExpectedCallsListForTest_002aaff0;
  SimpleString::SimpleString((SimpleString *)(local_b0 + 0x30),"differentScope::foobar");
  pMVar2 = MockExpectedCallsListForTest::addFunction
                     ((MockExpectedCallsListForTest *)(local_b0 + 0x20),
                      (SimpleString *)(local_b0 + 0x30));
  (*(pMVar2->super_MockExpectedCall)._vptr_MockExpectedCall[0x24])(pMVar2,1);
  SimpleString::~SimpleString((SimpleString *)(local_b0 + 0x30));
  pUVar4 = (this->super_TEST_GROUP_CppUTestGroupMockPlugin).test;
  SimpleString::SimpleString((SimpleString *)local_b0,"differentScope::foobar");
  MockExpectedObjectDidntHappenFailure::MockExpectedObjectDidntHappenFailure
            ((MockExpectedObjectDidntHappenFailure *)(local_b0 + 0x30),pUVar4,
             (SimpleString *)local_b0,(MockExpectedCallsList *)(local_b0 + 0x20));
  SimpleString::~SimpleString((SimpleString *)local_b0);
  SimpleString::SimpleString((SimpleString *)local_b0,"differentScope");
  pMVar3 = mock((SimpleString *)local_b0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString((SimpleString *)(local_b0 + 0x10),"foobar");
  iVar1 = (*pMVar3->_vptr_MockSupport[3])(pMVar3,local_b0 + 0x10);
  (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x120))
            ((long *)CONCAT44(extraout_var,iVar1),1);
  SimpleString::~SimpleString((SimpleString *)(local_b0 + 0x10));
  SimpleString::~SimpleString((SimpleString *)local_b0);
  SimpleString::SimpleString((SimpleString *)local_b0,"differentScope");
  pMVar3 = mock((SimpleString *)local_b0,(MockFailureReporter *)0x0);
  SimpleString::SimpleString((SimpleString *)(local_b0 + 0x10),"foobar");
  (*pMVar3->_vptr_MockSupport[6])(pMVar3,local_b0 + 0x10);
  SimpleString::~SimpleString((SimpleString *)(local_b0 + 0x10));
  SimpleString::~SimpleString((SimpleString *)local_b0);
  MockSupportPlugin::postTestAction
            (&(this->super_TEST_GROUP_CppUTestGroupMockPlugin).plugin,
             (this->super_TEST_GROUP_CppUTestGroupMockPlugin).test,
             (this->super_TEST_GROUP_CppUTestGroupMockPlugin).result);
  pUVar4 = UtestShell::getCurrent();
  TestFailure::getMessage((TestFailure *)local_b0);
  pcVar5 = SimpleString::asCharString((SimpleString *)local_b0);
  pcVar6 = SimpleString::asCharString
                     (&(this->super_TEST_GROUP_CppUTestGroupMockPlugin).output.output);
  (*pUVar4->_vptr_UtestShell[0xc])
            (pUVar4,pcVar5,pcVar6,0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockPluginTest.cpp"
             ,0x58);
  SimpleString::~SimpleString((SimpleString *)local_b0);
  CHECK_NO_MOCK_FAILURE_LOCATION
            ("/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTestExt/MockPluginTest.cpp"
             ,0x59);
  TestFailure::~TestFailure((TestFailure *)(local_b0 + 0x30));
  MockExpectedCallsListForTest::~MockExpectedCallsListForTest
            ((MockExpectedCallsListForTest *)(local_b0 + 0x20));
  MockFailureReporterInstaller::~MockFailureReporterInstaller(&local_b1);
  return;
}

Assistant:

TEST(MockPlugin, checkExpectationsWorksAlsoWithHierachicalObjects)
{
    MockFailureReporterInstaller failureReporterInstaller;

    MockExpectedCallsListForTest expectations;
    expectations.addFunction("differentScope::foobar")->onObject((void*) 1);
    MockExpectedObjectDidntHappenFailure expectedFailure(test, "differentScope::foobar", expectations);

    mock("differentScope").expectOneCall("foobar").onObject((void*) 1);
    mock("differentScope").actualCall("foobar");

    plugin.postTestAction(*test, *result);

    STRCMP_CONTAINS(expectedFailure.getMessage().asCharString(), output.getOutput().asCharString());
    CHECK_NO_MOCK_FAILURE();
}